

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

EventLogEntry * __thiscall
TTD::TTEventList::GetNextAvailableEntry(TTEventList *this,size_t requiredSize)

{
  TTEventListLink *pTVar1;
  size_t sVar2;
  
  if ((this->m_headBlock == (TTEventListLink *)0x0) ||
     (0xffff < this->m_headBlock->CurrPos + requiredSize)) {
    AddArrayLink(this);
  }
  pTVar1 = this->m_headBlock;
  sVar2 = pTVar1->CurrPos;
  pTVar1->CurrPos = requiredSize + sVar2;
  return (EventLogEntry *)(pTVar1->BlockData + sVar2);
}

Assistant:

NSLogEvents::EventLogEntry* TTEventList::GetNextAvailableEntry(size_t requiredSize)
    {
        if((this->m_headBlock == nullptr) || (this->m_headBlock->CurrPos + requiredSize >= TTD_EVENTLOG_LIST_BLOCK_SIZE))
        {
            this->AddArrayLink();
        }

        NSLogEvents::EventLogEntry* entry = reinterpret_cast<NSLogEvents::EventLogEntry*>(this->m_headBlock->BlockData + this->m_headBlock->CurrPos);
        this->m_headBlock->CurrPos += requiredSize;

        return entry;
    }